

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecryptionHelper.cpp
# Opt level: O1

EStatusCode __thiscall
DecryptionHelper::Setup(DecryptionHelper *this,PDFParser *inParser,string *inPassword)

{
  ByteList *inO;
  StringToXCryptionCommonMap *this_00;
  _Rb_tree_header *p_Var1;
  ByteList *inFileIDPart1;
  size_t *psVar2;
  _Base_ptr p_Var3;
  _List_node_base *p_Var4;
  pointer pcVar5;
  iteratorType iVar6;
  PDFName *pPVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  PDFDictionary *pPVar11;
  PDFObject *pPVar12;
  string *psVar13;
  Trace *pTVar14;
  longlong lVar15;
  unsigned_long uVar16;
  XCryptionCommon *pXVar17;
  const_iterator cVar18;
  _List_node_base *p_Var19;
  ByteList password;
  PDFObjectCastPtr<PDFDictionary> encryptionDictionary;
  PDFObjectCastPtr<PDFName> streamsFilterName;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  cryptFiltersIt;
  PDFObjectCastPtr<PDFName> stringsFilterName;
  ParsedPrimitiveHelper idPart1ObjectHelper;
  RefCountPtr<PDFObject> length;
  RefCountPtr<PDFObject> p;
  RefCountPtr<PDFObject> u;
  PDFObjectCastPtr<PDFName> filter;
  PDFObjectCastPtr<PDFArray> idArray;
  RefCountPtr<PDFObject> lengthObject;
  PDFObjectCastPtr<PDFBoolean> encryptMetadata;
  RefCountPtr<PDFObject> o;
  RefCountPtr<PDFObject> revision;
  RefCountPtr<PDFObject> v;
  
  this->mSupportsDecryption = false;
  this->mFailedPasswordVerification = false;
  this->mDidSucceedOwnerPasswordVerification = false;
  this->mParser = inParser;
  pPVar11 = PDFParser::GetTrailer(inParser);
  psVar2 = &password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node
            ._M_size;
  password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&password,"Encrypt","");
  pPVar12 = PDFParser::QueryDictionaryObject(inParser,pPVar11,(string *)&password);
  encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue =
       PDFObjectCast<PDFDictionary>(pPVar12);
  encryptionDictionary.super_RefCountPtr<PDFDictionary>._vptr_RefCountPtr =
       (_func_int **)&PTR__RefCountPtr_003a97b0;
  if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)psVar2) {
    operator_delete(password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    ._M_node.super__List_node_base._M_next,
                    password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    ._M_node._M_size + 1);
  }
  pPVar11 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
  this->mIsEncrypted =
       encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue != (PDFDictionary *)0x0;
  if (encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue == (PDFDictionary *)0x0)
  goto LAB_00206902;
  password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&password,"Filter","");
  pPVar12 = PDFParser::QueryDictionaryObject(inParser,pPVar11,(string *)&password);
  filter.super_RefCountPtr<PDFName>.mValue = PDFObjectCast<PDFName>(pPVar12);
  filter.super_RefCountPtr<PDFName>._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9888;
  if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)psVar2) {
    operator_delete(password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    ._M_node.super__List_node_base._M_next,
                    password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    ._M_node._M_size + 1);
  }
  if (filter.super_RefCountPtr<PDFName>.mValue == (PDFName *)0x0) {
LAB_00205bc3:
    if (filter.super_RefCountPtr<PDFName>.mValue == (PDFName *)0x0) {
      pTVar14 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar14,"DecryptionHelper::Setup, no filter defined");
    }
    else {
      pTVar14 = Trace::DefaultTrace();
      psVar13 = PDFName::GetValue_abi_cxx11_(filter.super_RefCountPtr<PDFName>.mValue);
      std::__cxx11::string::substr((ulong)&password,(ulong)psVar13);
      Trace::TraceToLog(pTVar14,
                        "DecryptionHelper::Setup, Only Standard encryption filter is supported. Unsupported filter encountered - %s"
                        ,password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl._M_node.super__List_node_base._M_next);
      if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
          super__List_node_base._M_next != (_List_node_base *)psVar2) {
        operator_delete(password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl._M_node.super__List_node_base._M_next,
                        password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl._M_node._M_size + 1);
      }
    }
  }
  else {
    psVar13 = PDFName::GetValue_abi_cxx11_(filter.super_RefCountPtr<PDFName>.mValue);
    iVar9 = std::__cxx11::string::compare((char *)psVar13);
    pPVar11 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
    if (iVar9 != 0) goto LAB_00205bc3;
    password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)psVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&password,"V","");
    v.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar11,(string *)&password);
    v._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9780;
    if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)psVar2) {
      operator_delete(password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node.super__List_node_base._M_next,
                      password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node._M_size + 1);
    }
    if (v.mValue == (PDFObject *)0x0) {
      this->mV = 0;
LAB_00205ce8:
      pPVar11 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
      if ((this->mV < 5) && ((0x16U >> (this->mV & 0x1f) & 1) != 0)) {
        password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
        super__List_node_base._M_next = (_List_node_base *)psVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&password,"R","");
        revision.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar11,(string *)&password);
        revision._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9780;
        if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node
            .super__List_node_base._M_next != (_List_node_base *)psVar2) {
          operator_delete(password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl._M_node.super__List_node_base._M_next,
                          password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl._M_node._M_size + 1);
        }
        if (revision.mValue != (PDFObject *)0x0) {
          ParsedPrimitiveHelper::ParsedPrimitiveHelper
                    ((ParsedPrimitiveHelper *)&password,revision.mValue);
          bVar8 = ParsedPrimitiveHelper::IsNumber((ParsedPrimitiveHelper *)&password);
          if (bVar8) {
            lVar15 = ParsedPrimitiveHelper::GetAsInteger((ParsedPrimitiveHelper *)&password);
            this->mRevision = (uint)lVar15;
            ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password);
            pPVar11 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
            if (bVar8) {
              password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              _M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&password,"O","");
              o.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar11,(string *)&password);
              o._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9780;
              if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  _M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
                operator_delete(password.
                                super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl._M_node.super__List_node_base._M_next,
                                password.
                                super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl._M_node._M_size + 1);
              }
              if (o.mValue != (PDFObject *)0x0) {
                ParsedPrimitiveHelper::ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&u,o.mValue);
                ParsedPrimitiveHelper::ToString_abi_cxx11_
                          ((string *)&password,(ParsedPrimitiveHelper *)&u);
                XCryptionCommon::stringToByteList((ByteList *)&cryptFiltersIt,(string *)&password);
                inO = &this->mO;
                std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                          (inO,(_Base_ptr)&cryptFiltersIt);
                iVar6 = cryptFiltersIt.
                        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                        .mEndPosition;
                while (iVar6._M_node != (_Base_ptr)&cryptFiltersIt) {
                  p_Var3 = *iVar6._M_node;
                  operator_delete(iVar6._M_node,0x18);
                  iVar6._M_node = p_Var3;
                }
                if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    ._M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
                  operator_delete(password.
                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl._M_node.super__List_node_base._M_next,
                                  password.
                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl._M_node._M_size + 1);
                }
                ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&u);
                pPVar11 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                _M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&password,"U","");
                u.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar11,(string *)&password);
                u._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9780;
                if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    ._M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
                  operator_delete(password.
                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl._M_node.super__List_node_base._M_next,
                                  password.
                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl._M_node._M_size + 1);
                }
                if (u.mValue != (PDFObject *)0x0) {
                  ParsedPrimitiveHelper::ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&p,u.mValue)
                  ;
                  ParsedPrimitiveHelper::ToString_abi_cxx11_
                            ((string *)&password,(ParsedPrimitiveHelper *)&p);
                  XCryptionCommon::stringToByteList((ByteList *)&cryptFiltersIt,(string *)&password)
                  ;
                  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                            (&this->mU,(_Base_ptr)&cryptFiltersIt);
                  iVar6 = cryptFiltersIt.
                          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                          .mEndPosition;
                  while (iVar6._M_node != (_Base_ptr)&cryptFiltersIt) {
                    p_Var3 = *iVar6._M_node;
                    operator_delete(iVar6._M_node,0x18);
                    iVar6._M_node = p_Var3;
                  }
                  if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
                    operator_delete(password.
                                    super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                    _M_impl._M_node.super__List_node_base._M_next,
                                    password.
                                    super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                    _M_impl._M_node._M_size + 1);
                  }
                  ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&p);
                  pPVar11 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                  password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  _M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&password,"P","");
                  p.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar11,(string *)&password);
                  p._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9780;
                  if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)psVar2) {
                    operator_delete(password.
                                    super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                    _M_impl._M_node.super__List_node_base._M_next,
                                    password.
                                    super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                    _M_impl._M_node._M_size + 1);
                  }
                  if (p.mValue != (PDFObject *)0x0) {
                    ParsedPrimitiveHelper::ParsedPrimitiveHelper
                              ((ParsedPrimitiveHelper *)&password,p.mValue);
                    bVar8 = ParsedPrimitiveHelper::IsNumber((ParsedPrimitiveHelper *)&password);
                    if (bVar8) {
                      lVar15 = ParsedPrimitiveHelper::GetAsInteger
                                         ((ParsedPrimitiveHelper *)&password);
                      this->mP = lVar15;
                      ParsedPrimitiveHelper::~ParsedPrimitiveHelper
                                ((ParsedPrimitiveHelper *)&password);
                      pPVar11 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                      if (bVar8) {
                        password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&password,"EncryptMetadata","");
                        pPVar12 = PDFParser::QueryDictionaryObject
                                            (inParser,pPVar11,(string *)&password);
                        encryptMetadata.super_RefCountPtr<PDFBoolean>.mValue =
                             PDFObjectCast<PDFBoolean>(pPVar12);
                        encryptMetadata.super_RefCountPtr<PDFBoolean>._vptr_RefCountPtr =
                             (_func_int **)&PTR__RefCountPtr_003ab068;
                        if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node.super__List_node_base._M_next !=
                            (_List_node_base *)psVar2) {
                          operator_delete(password.
                                          super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl._M_node.super__List_node_base._M_next,
                                          password.
                                          super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl._M_node._M_size + 1);
                        }
                        if (encryptMetadata.super_RefCountPtr<PDFBoolean>.mValue ==
                            (PDFBoolean *)0x0) {
                          this->mEncryptMetaData = true;
                        }
                        else {
                          bVar8 = PDFBoolean::GetValue
                                            (encryptMetadata.super_RefCountPtr<PDFBoolean>.mValue);
                          this->mEncryptMetaData = bVar8;
                        }
                        password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl._M_node._M_size = 0;
                        inFileIDPart1 = &this->mFileIDPart1;
                        password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&password
                        ;
                        password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&password
                        ;
                        std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::
                        _M_move_assign(inFileIDPart1,&password);
                        p_Var19 = password.
                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl._M_node.super__List_node_base._M_next;
                        if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node.super__List_node_base._M_next !=
                            (_List_node_base *)&password) {
                          do {
                            p_Var4 = p_Var19->_M_next;
                            operator_delete(p_Var19,0x18);
                            p_Var19 = p_Var4;
                          } while (p_Var4 != (_List_node_base *)&password);
                        }
                        pPVar11 = PDFParser::GetTrailer(inParser);
                        password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&password,"ID","")
                        ;
                        pPVar12 = PDFParser::QueryDictionaryObject
                                            (inParser,pPVar11,(string *)&password);
                        idArray.super_RefCountPtr<PDFArray>.mValue =
                             PDFObjectCast<PDFArray>(pPVar12);
                        idArray.super_RefCountPtr<PDFArray>._vptr_RefCountPtr =
                             (_func_int **)&PTR__RefCountPtr_003a97e8;
                        if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node.super__List_node_base._M_next !=
                            (_List_node_base *)psVar2) {
                          operator_delete(password.
                                          super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl._M_node.super__List_node_base._M_next,
                                          password.
                                          super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl._M_node._M_size + 1);
                        }
                        if ((idArray.super_RefCountPtr<PDFArray>.mValue != (PDFArray *)0x0) &&
                           (uVar16 = PDFArray::GetLength(idArray.super_RefCountPtr<PDFArray>.mValue)
                           , uVar16 != 0)) {
                          length.mValue =
                               PDFParser::QueryArrayObject
                                         (inParser,idArray.super_RefCountPtr<PDFArray>.mValue,0);
                          length._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9780;
                          if (length.mValue != (PDFObject *)0x0) {
                            ParsedPrimitiveHelper::ParsedPrimitiveHelper
                                      (&idPart1ObjectHelper,length.mValue);
                            ParsedPrimitiveHelper::ToString_abi_cxx11_
                                      ((string *)&password,&idPart1ObjectHelper);
                            XCryptionCommon::stringToByteList
                                      ((ByteList *)&cryptFiltersIt,(string *)&password);
                            std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::
                            _M_move_assign(inFileIDPart1,(_Base_ptr)&cryptFiltersIt);
                            iVar6 = cryptFiltersIt.
                                    super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                    .mEndPosition;
                            while (iVar6._M_node != (_Base_ptr)&cryptFiltersIt) {
                              p_Var3 = *iVar6._M_node;
                              operator_delete(iVar6._M_node,0x18);
                              iVar6._M_node = p_Var3;
                            }
                            if (password.
                                super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl._M_node.super__List_node_base._M_next !=
                                (_List_node_base *)psVar2) {
                              operator_delete(password.
                                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl._M_node.super__List_node_base._M_next,
                                              password.
                                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl._M_node._M_size + 1);
                            }
                            ParsedPrimitiveHelper::~ParsedPrimitiveHelper(&idPart1ObjectHelper);
                          }
                          RefCountPtr<PDFObject>::~RefCountPtr(&length);
                        }
                        pPVar11 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                        password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&password,"Length","");
                        length.mValue =
                             PDFParser::QueryDictionaryObject(inParser,pPVar11,(string *)&password);
                        length._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9780;
                        if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node.super__List_node_base._M_next !=
                            (_List_node_base *)psVar2) {
                          operator_delete(password.
                                          super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl._M_node.super__List_node_base._M_next,
                                          password.
                                          super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl._M_node._M_size + 1);
                        }
                        if (length.mValue == (PDFObject *)0x0) {
                          uVar10 = 5;
                        }
                        else {
                          uVar10 = ComputeByteLength(length.mValue);
                        }
                        pPVar11 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                        this->mLength = uVar10;
                        if (this->mV == 4) {
                          password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&password,"CF","");
                          pPVar12 = PDFParser::QueryDictionaryObject
                                              (inParser,pPVar11,(string *)&password);
                          pPVar11 = PDFObjectCast<PDFDictionary>(pPVar12);
                          idPart1ObjectHelper.mWrappedObject =
                               (PDFObject *)&PTR__RefCountPtr_003a97b0;
                          if (password.
                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl._M_node.super__List_node_base._M_next !=
                              (_List_node_base *)psVar2) {
                            operator_delete(password.
                                            super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl._M_node.super__List_node_base._M_next,
                                            password.
                                            super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl._M_node._M_size + 1);
                          }
                          if (pPVar11 != (PDFDictionary *)0x0) {
                            PDFDictionary::GetIterator(&cryptFiltersIt,pPVar11);
                            if (cryptFiltersIt.
                                super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                .mCurrentPosition._M_node !=
                                cryptFiltersIt.
                                super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                .mEndPosition._M_node) {
                              do {
                                iVar6._M_node =
                                     cryptFiltersIt.
                                     super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                     .mEndPosition._M_node;
                                if (cryptFiltersIt.
                                    super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                    .mFirstMove == true) {
                                  cryptFiltersIt.
                                  super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                  .mFirstMove = false;
                                }
                                else {
                                  cryptFiltersIt.
                                  super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                  .mCurrentPosition._M_node =
                                       (_Base_ptr)
                                       std::_Rb_tree_increment
                                                 (cryptFiltersIt.
                                                  super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                                  .mCurrentPosition._M_node);
                                  if (cryptFiltersIt.
                                      super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                      .mCurrentPosition._M_node == iVar6._M_node) break;
                                }
                                streamsFilterName.super_RefCountPtr<PDFName>.mValue = (PDFName *)0x0
                                ;
                                streamsFilterName.super_RefCountPtr<PDFName>._vptr_RefCountPtr =
                                     (_func_int **)&PTR__RefCountPtr_003a97b0;
                                pPVar11 = PDFObjectCast<PDFDictionary>
                                                    ((PDFObject *)
                                                     cryptFiltersIt.
                                                                                                          
                                                  super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                                  .mCurrentPosition._M_node[1]._M_parent);
                                RefCountPtr<PDFDictionary>::operator=
                                          ((RefCountPtr<PDFDictionary> *)&streamsFilterName,pPVar11)
                                ;
                                pPVar7 = streamsFilterName.super_RefCountPtr<PDFName>.mValue;
                                if (streamsFilterName.super_RefCountPtr<PDFName>.mValue !=
                                    (PDFName *)0x0) {
                                  password.
                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl._M_node.super__List_node_base._M_next =
                                       (_List_node_base *)psVar2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&password,"CFM","");
                                  pPVar12 = PDFParser::QueryDictionaryObject
                                                      (inParser,(PDFDictionary *)pPVar7,
                                                       (string *)&password);
                                  stringsFilterName.super_RefCountPtr<PDFName>.mValue =
                                       PDFObjectCast<PDFName>(pPVar12);
                                  stringsFilterName.super_RefCountPtr<PDFName>._vptr_RefCountPtr =
                                       (_func_int **)&PTR__RefCountPtr_003a9888;
                                  if (password.
                                      super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl._M_node.super__List_node_base._M_next !=
                                      (_List_node_base *)psVar2) {
                                    operator_delete(password.
                                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next,
                                                  password.
                                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl._M_node._M_size + 1);
                                  }
                                  pPVar7 = streamsFilterName.super_RefCountPtr<PDFName>.mValue;
                                  password.
                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl._M_node.super__List_node_base._M_next =
                                       (_List_node_base *)psVar2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&password,"Length","");
                                  lengthObject.mValue =
                                       PDFParser::QueryDictionaryObject
                                                 (inParser,(PDFDictionary *)pPVar7,
                                                  (string *)&password);
                                  lengthObject._vptr_RefCountPtr =
                                       (_func_int **)&PTR__RefCountPtr_003a9780;
                                  if (password.
                                      super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl._M_node.super__List_node_base._M_next !=
                                      (_List_node_base *)psVar2) {
                                    operator_delete(password.
                                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next,
                                                  password.
                                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl._M_node._M_size + 1);
                                  }
                                  if (lengthObject.mValue == (PDFObject *)0x0) {
                                    uVar10 = this->mLength;
                                  }
                                  else {
                                    uVar10 = ComputeByteLength(lengthObject.mValue);
                                  }
                                  pXVar17 = (XCryptionCommon *)operator_new(0x58);
                                  XCryptionCommon::XCryptionCommon(pXVar17);
                                  psVar13 = PDFName::GetValue_abi_cxx11_
                                                      (stringsFilterName.super_RefCountPtr<PDFName>.
                                                       mValue);
                                  iVar9 = std::__cxx11::string::compare((char *)psVar13);
                                  XCryptionCommon::Setup(pXVar17,iVar9 == 0);
                                  XCryptionCommon::SetupInitialEncryptionKey
                                            (pXVar17,inPassword,this->mRevision,uVar10,inO,this->mP,
                                             inFileIDPart1,this->mEncryptMetaData);
                                  psVar13 = PDFName::GetValue_abi_cxx11_
                                                      (*(PDFName **)
                                                        (cryptFiltersIt.
                                                                                                                  
                                                  super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                                  .mCurrentPosition._M_node + 1));
                                  pcVar5 = (psVar13->_M_dataplus)._M_p;
                                  password.
                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl._M_node.super__List_node_base._M_next =
                                       (_List_node_base *)psVar2;
                                  std::__cxx11::string::_M_construct<char*>
                                            ((string *)&password,pcVar5,
                                             pcVar5 + psVar13->_M_string_length);
                                  std::
                                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
                                  ::
                                  _M_insert_unique<std::pair<std::__cxx11::string_const,XCryptionCommon*>>
                                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
                                              *)&this->mXcrypts,
                                             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
                                              *)&password);
                                  if (password.
                                      super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl._M_node.super__List_node_base._M_next !=
                                      (_List_node_base *)psVar2) {
                                    operator_delete(password.
                                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next,
                                                  password.
                                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl._M_node._M_size + 1);
                                  }
                                  RefCountPtr<PDFObject>::~RefCountPtr(&lengthObject);
                                  RefCountPtr<PDFName>::~RefCountPtr
                                            (&stringsFilterName.super_RefCountPtr<PDFName>);
                                }
                                RefCountPtr<PDFDictionary>::~RefCountPtr
                                          ((RefCountPtr<PDFDictionary> *)&streamsFilterName);
                              } while (cryptFiltersIt.
                                       super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                       .mCurrentPosition._M_node !=
                                       cryptFiltersIt.
                                       super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                       .mEndPosition._M_node);
                            }
                            pPVar11 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                            password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node.super__List_node_base._M_next =
                                 (_List_node_base *)psVar2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&password,"StmF","");
                            pPVar12 = PDFParser::QueryDictionaryObject
                                                (inParser,pPVar11,(string *)&password);
                            streamsFilterName.super_RefCountPtr<PDFName>.mValue =
                                 PDFObjectCast<PDFName>(pPVar12);
                            streamsFilterName.super_RefCountPtr<PDFName>._vptr_RefCountPtr =
                                 (_func_int **)&PTR__RefCountPtr_003a9888;
                            if (password.
                                super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl._M_node.super__List_node_base._M_next !=
                                (_List_node_base *)psVar2) {
                              operator_delete(password.
                                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl._M_node.super__List_node_base._M_next,
                                              password.
                                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl._M_node._M_size + 1);
                            }
                            pPVar11 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                            password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node.super__List_node_base._M_next =
                                 (_List_node_base *)psVar2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&password,"StrF","");
                            pPVar12 = PDFParser::QueryDictionaryObject
                                                (inParser,pPVar11,(string *)&password);
                            stringsFilterName.super_RefCountPtr<PDFName>.mValue =
                                 PDFObjectCast<PDFName>(pPVar12);
                            stringsFilterName.super_RefCountPtr<PDFName>._vptr_RefCountPtr =
                                 (_func_int **)&PTR__RefCountPtr_003a9888;
                            if (password.
                                super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl._M_node.super__List_node_base._M_next !=
                                (_List_node_base *)psVar2) {
                              operator_delete(password.
                                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl._M_node.super__List_node_base._M_next,
                                              password.
                                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl._M_node._M_size + 1);
                            }
                            if (streamsFilterName.super_RefCountPtr<PDFName>.mValue ==
                                (PDFName *)0x0) {
                              password.
                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl._M_node.super__List_node_base._M_next =
                                   (_List_node_base *)psVar2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&password,"Identity","");
                            }
                            else {
                              psVar13 = PDFName::GetValue_abi_cxx11_
                                                  (streamsFilterName.super_RefCountPtr<PDFName>.
                                                   mValue);
                              pcVar5 = (psVar13->_M_dataplus)._M_p;
                              password.
                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl._M_node.super__List_node_base._M_next =
                                   (_List_node_base *)psVar2;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&password,pcVar5,
                                         pcVar5 + psVar13->_M_string_length);
                            }
                            this_00 = &this->mXcrypts;
                            cVar18 = std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>_>
                                     ::find(&this_00->_M_t,(key_type *)&password);
                            p_Var1 = &(this->mXcrypts)._M_t._M_impl.super__Rb_tree_header;
                            if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
                              pXVar17 = (XCryptionCommon *)0x0;
                            }
                            else {
                              pXVar17 = *(XCryptionCommon **)(cVar18._M_node + 2);
                            }
                            this->mXcryptStreams = pXVar17;
                            if (password.
                                super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl._M_node.super__List_node_base._M_next !=
                                (_List_node_base *)psVar2) {
                              operator_delete(password.
                                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl._M_node.super__List_node_base._M_next,
                                              password.
                                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl._M_node._M_size + 1);
                            }
                            if (stringsFilterName.super_RefCountPtr<PDFName>.mValue ==
                                (PDFName *)0x0) {
                              password.
                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl._M_node.super__List_node_base._M_next =
                                   (_List_node_base *)psVar2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&password,"Identity","");
                            }
                            else {
                              psVar13 = PDFName::GetValue_abi_cxx11_
                                                  (stringsFilterName.super_RefCountPtr<PDFName>.
                                                   mValue);
                              pcVar5 = (psVar13->_M_dataplus)._M_p;
                              password.
                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl._M_node.super__List_node_base._M_next =
                                   (_List_node_base *)psVar2;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&password,pcVar5,
                                         pcVar5 + psVar13->_M_string_length);
                            }
                            cVar18 = std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>_>
                                     ::find(&this_00->_M_t,(key_type *)&password);
                            if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
                              pXVar17 = (XCryptionCommon *)0x0;
                            }
                            else {
                              pXVar17 = *(XCryptionCommon **)(cVar18._M_node + 2);
                            }
                            this->mXcryptStrings = pXVar17;
                            if (password.
                                super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl._M_node.super__List_node_base._M_next !=
                                (_List_node_base *)psVar2) {
                              operator_delete(password.
                                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl._M_node.super__List_node_base._M_next,
                                              password.
                                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl._M_node._M_size + 1);
                            }
                            cVar18 = std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>_>
                                     ::find(&this_00->_M_t,&scStdCF_abi_cxx11_);
                            if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
                              pXVar17 = (XCryptionCommon *)0x0;
                            }
                            else {
                              pXVar17 = *(XCryptionCommon **)(cVar18._M_node + 2);
                            }
                            this->mXcryptAuthentication = pXVar17;
                            RefCountPtr<PDFName>::~RefCountPtr
                                      (&stringsFilterName.super_RefCountPtr<PDFName>);
                            RefCountPtr<PDFName>::~RefCountPtr
                                      (&streamsFilterName.super_RefCountPtr<PDFName>);
                          }
                          RefCountPtr<PDFDictionary>::~RefCountPtr
                                    ((RefCountPtr<PDFDictionary> *)&idPart1ObjectHelper);
                        }
                        else {
                          pXVar17 = (XCryptionCommon *)operator_new(0x58);
                          XCryptionCommon::XCryptionCommon(pXVar17);
                          XCryptionCommon::Setup(pXVar17,false);
                          XCryptionCommon::SetupInitialEncryptionKey
                                    (pXVar17,inPassword,this->mRevision,this->mLength,inO,this->mP,
                                     inFileIDPart1,this->mEncryptMetaData);
                          password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)psVar2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&password,scStdCF_abi_cxx11_._M_dataplus._M_p,
                                     scStdCF_abi_cxx11_._M_dataplus._M_p +
                                     scStdCF_abi_cxx11_._M_string_length);
                          std::
                          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
                          ::_M_insert_unique<std::pair<std::__cxx11::string_const,XCryptionCommon*>>
                                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
                                      *)&this->mXcrypts,
                                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
                                      *)&password);
                          if (password.
                              super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl._M_node.super__List_node_base._M_next !=
                              (_List_node_base *)psVar2) {
                            operator_delete(password.
                                            super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl._M_node.super__List_node_base._M_next,
                                            password.
                                            super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl._M_node._M_size + 1);
                          }
                          this->mXcryptStreams = pXVar17;
                          this->mXcryptStrings = pXVar17;
                          this->mXcryptAuthentication = pXVar17;
                        }
                        XCryptionCommon::stringToByteList(&password,inPassword);
                        bVar8 = AuthenticateOwnerPassword(this,&password);
                        this->mDidSucceedOwnerPasswordVerification = bVar8;
                        if (bVar8) {
                          bVar8 = false;
                        }
                        else {
                          bVar8 = AuthenticateUserPassword(this,&password);
                          bVar8 = !bVar8;
                        }
                        this->mFailedPasswordVerification = bVar8;
                        this->mSupportsDecryption = true;
                        p_Var19 = password.
                                  super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl._M_node.super__List_node_base._M_next;
                        if (password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl._M_node.super__List_node_base._M_next !=
                            (_List_node_base *)&password) {
                          do {
                            p_Var4 = p_Var19->_M_next;
                            operator_delete(p_Var19,0x18);
                            p_Var19 = p_Var4;
                          } while (p_Var4 != (_List_node_base *)&password);
                        }
                        RefCountPtr<PDFObject>::~RefCountPtr(&length);
                        RefCountPtr<PDFArray>::~RefCountPtr(&idArray.super_RefCountPtr<PDFArray>);
                        RefCountPtr<PDFBoolean>::~RefCountPtr
                                  (&encryptMetadata.super_RefCountPtr<PDFBoolean>);
                      }
                    }
                    else {
                      ParsedPrimitiveHelper::~ParsedPrimitiveHelper
                                ((ParsedPrimitiveHelper *)&password);
                    }
                  }
                  RefCountPtr<PDFObject>::~RefCountPtr(&p);
                }
                RefCountPtr<PDFObject>::~RefCountPtr(&u);
              }
              RefCountPtr<PDFObject>::~RefCountPtr(&o);
            }
          }
          else {
            ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password);
          }
        }
        RefCountPtr<PDFObject>::~RefCountPtr(&revision);
      }
      else {
        pTVar14 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar14,
                          "DecryptionHelper::Setup, Only 1 and 2 are supported values for V. Unsupported filter encountered - %d"
                          ,(ulong)this->mV);
      }
    }
    else {
      ParsedPrimitiveHelper::ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password,v.mValue);
      bVar8 = ParsedPrimitiveHelper::IsNumber((ParsedPrimitiveHelper *)&password);
      if (bVar8) {
        lVar15 = ParsedPrimitiveHelper::GetAsInteger((ParsedPrimitiveHelper *)&password);
        this->mV = (uint)lVar15;
        ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password);
        if (bVar8) goto LAB_00205ce8;
      }
      else {
        ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password);
      }
    }
    RefCountPtr<PDFObject>::~RefCountPtr(&v);
  }
  RefCountPtr<PDFName>::~RefCountPtr(&filter.super_RefCountPtr<PDFName>);
LAB_00206902:
  RefCountPtr<PDFDictionary>::~RefCountPtr(&encryptionDictionary.super_RefCountPtr<PDFDictionary>);
  return eSuccess;
}

Assistant:

EStatusCode DecryptionHelper::Setup(PDFParser* inParser, const string& inPassword) {
	mSupportsDecryption = false;
	mFailedPasswordVerification = false;
	mDidSucceedOwnerPasswordVerification = false;
	mParser = inParser;

	// setup encrypted flag through the existance of encryption dict
	PDFObjectCastPtr<PDFDictionary> encryptionDictionary(inParser->QueryDictionaryObject(inParser->GetTrailer(), "Encrypt"));
	mIsEncrypted = encryptionDictionary.GetPtr() != NULL;

	do {
		if (!mIsEncrypted)
			break;

		PDFObjectCastPtr<PDFName> filter(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "Filter"));
		if (!filter || filter->GetValue() != "Standard") {
			// Supporting only standard filter
			if(!filter)
				TRACE_LOG("DecryptionHelper::Setup, no filter defined");
			else
				TRACE_LOG1("DecryptionHelper::Setup, Only Standard encryption filter is supported. Unsupported filter encountered - %s",filter->GetValue().substr(0, MAX_TRACE_SIZE - 200).c_str());
			break;
		}

		RefCountPtr<PDFObject> v(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "V"));
		if (!v) {
			mV = 0;
		} else {
			ParsedPrimitiveHelper vHelper(v.GetPtr());
			if (!vHelper.IsNumber())
				break;
			mV = (unsigned int)vHelper.GetAsInteger();
		}

		// supporting versions 1,2 and 4
		if (mV != 1 && mV != 2 && mV != 4) {
			TRACE_LOG1("DecryptionHelper::Setup, Only 1 and 2 are supported values for V. Unsupported filter encountered - %d", mV);
			break;
		}

		RefCountPtr<PDFObject> revision(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "R"));
		if (!revision) {
			break;
		}
		else {
			ParsedPrimitiveHelper revisionHelper(revision.GetPtr());
			if (!revisionHelper.IsNumber())
				break;
			mRevision = (unsigned int)revisionHelper.GetAsInteger();
		}

		RefCountPtr<PDFObject> o(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "O"));
		if (!o) {
			break;
		}
		else {
			ParsedPrimitiveHelper oHelper(o.GetPtr());
			mO = XCryptionCommon::stringToByteList(oHelper.ToString());
		}

		RefCountPtr<PDFObject> u(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "U"));
		if (!u) {
			break;
		}
		else {
			ParsedPrimitiveHelper uHelper(u.GetPtr());
			mU = XCryptionCommon::stringToByteList(uHelper.ToString());
		}

		RefCountPtr<PDFObject> p(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "P"));
		if (!p) {
			break;
		}
		else {
			ParsedPrimitiveHelper pHelper(p.GetPtr());
			if (!pHelper.IsNumber())
				break;
			mP = pHelper.GetAsInteger();
		}

		PDFObjectCastPtr<PDFBoolean> encryptMetadata(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "EncryptMetadata"));
		if (!encryptMetadata) {
			mEncryptMetaData = true;
		}
		else {
			mEncryptMetaData = encryptMetadata->GetValue();
		}

		// grab file ID from trailer
		mFileIDPart1 = ByteList();
		PDFObjectCastPtr<PDFArray> idArray(inParser->QueryDictionaryObject(inParser->GetTrailer(), "ID"));
		if (!!idArray && idArray->GetLength() > 0) {
			RefCountPtr<PDFObject> idPart1Object(inParser->QueryArrayObject(idArray.GetPtr(), 0));
			if (!!idPart1Object) {
				ParsedPrimitiveHelper idPart1ObjectHelper(idPart1Object.GetPtr());
				mFileIDPart1 = XCryptionCommon::stringToByteList(idPart1ObjectHelper.ToString());
			}
		}


		RefCountPtr<PDFObject> length(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "Length"));
		if (!length) {
			mLength = 40 / 8;
		}
		else {
			mLength = ComputeByteLength(length.GetPtr());
		}

		// Setup crypt filters, or a default filter
		if (mV == 4) {
			// multiple xcryptions. read crypt filters, determine which does what
			PDFObjectCastPtr<PDFDictionary> cryptFilters(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "CF"));
			if (!!cryptFilters) {
				MapIterator<PDFNameToPDFObjectMap>  cryptFiltersIt = cryptFilters->GetIterator();

				// read crypt filters
				while (cryptFiltersIt.MoveNext())
				{
					PDFObjectCastPtr<PDFDictionary> cryptFilter;
					// A little caveat of those smart ptrs need to be handled here
					// make sure to pass the pointer after init...otherwise cast wont do addref
					// and object will be released
					cryptFilter = cryptFiltersIt.GetValue();
					if (!!cryptFilter) {
						PDFObjectCastPtr<PDFName> cfmName(inParser->QueryDictionaryObject(cryptFilter.GetPtr(), "CFM"));
						RefCountPtr<PDFObject> lengthObject(inParser->QueryDictionaryObject(cryptFilter.GetPtr(), "Length"));
						unsigned int length = !lengthObject ? mLength : ComputeByteLength(lengthObject.GetPtr());

						XCryptionCommon* encryption = new XCryptionCommon();
						encryption->Setup(cfmName->GetValue() == "AESV2"); // singe xcryptions are always RC4
						encryption->SetupInitialEncryptionKey(
							inPassword,
							mRevision,
							length,
							mO,
							mP,
							mFileIDPart1,
							mEncryptMetaData);
						mXcrypts.insert(StringToXCryptionCommonMap::value_type(cryptFiltersIt.GetKey()->GetValue(), encryption));
					}
				}
				

				PDFObjectCastPtr<PDFName> streamsFilterName(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "StmF"));
				PDFObjectCastPtr<PDFName> stringsFilterName(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "StrF"));
				mXcryptStreams = GetFilterForName(mXcrypts, !streamsFilterName ? "Identity": streamsFilterName->GetValue());
				mXcryptStrings = GetFilterForName(mXcrypts, !stringsFilterName ? "Identity" : stringsFilterName->GetValue());
				mXcryptAuthentication = GetFilterForName(mXcrypts, scStdCF);
			}

		}
		else {
			// single xcryption, use as the single encryption source
			XCryptionCommon* defaultEncryption = new XCryptionCommon();
			defaultEncryption->Setup(false); // single xcryptions are always RC4
			defaultEncryption->SetupInitialEncryptionKey(
				inPassword,
				mRevision,
				mLength,
				mO,
				mP,
				mFileIDPart1,
				mEncryptMetaData);

			mXcrypts.insert(StringToXCryptionCommonMap::value_type(scStdCF, defaultEncryption));
			mXcryptStreams = defaultEncryption;
			mXcryptStrings = defaultEncryption;
			mXcryptAuthentication = defaultEncryption;
		}

		// authenticate password, try to determine if user or owner
		ByteList password = XCryptionCommon::stringToByteList(inPassword);
		mDidSucceedOwnerPasswordVerification = AuthenticateOwnerPassword(password);
		mFailedPasswordVerification = !mDidSucceedOwnerPasswordVerification && !AuthenticateUserPassword(password);


		mSupportsDecryption = true;
	}while(false);

	return eSuccess;
}